

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

size_t shuff_compress(uint8_t *out_u8,size_t out_size_u8,uint32_t *input_u32,size_t input_size)

{
  uint32_t *puVar1;
  uint64_t *freq;
  uint64_t *syms;
  uint32_t *puVar2;
  uint64_t uVar3;
  uint uVar4;
  bit_io_t bio;
  
  bio.bytes_written = 0;
  bio.buff_btg = 0x40;
  bio.init_out_u8 = out_u8;
  bio.out_u64 = (uint64_t *)out_u8;
  freq = (uint64_t *)shuff_allocate(0x40000002);
  syms = (uint64_t *)shuff_allocate(0x40000002);
  puVar1 = input_u32 + input_size;
  uVar3 = 0;
  puVar2 = input_u32;
  while( true ) {
    if (puVar1 <= puVar2) {
      uVar3 = shuff_one_pass_freq_count(input_u32,input_size,freq,syms,uVar3);
      shuff_build_codes(&bio,syms,freq,uVar3);
      for (; input_u32 < puVar1; input_u32 = input_u32 + 1) {
        shuff_output(&bio,(ulong)(*input_u32 + 1),syms,freq);
      }
      free(freq);
      free(syms);
      if (bio.buff_btg != 0x40) {
        *bio.out_u64 = *bio.out_u64 << ((byte)bio.buff_btg & 0x3f);
      }
      return (long)bio.out_u64 - (long)bio.init_out_u8;
    }
    uVar4 = *puVar2 + 1;
    if (0x8000000 < uVar4) break;
    if (uVar3 <= uVar4) {
      uVar3 = (ulong)uVar4;
    }
    puVar2 = puVar2 + 1;
  }
  fprintf(_stderr,"Symbol %u is out of range.\n");
  exit(-1);
}

Assistant:

inline size_t shuff_compress(uint8_t* out_u8, size_t out_size_u8,
    const uint32_t* input_u32, size_t input_size)
{
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    bit_io_t bio;
    SHUFF_START_OUTPUT(&bio, out_u8);

    const uint32_t* up;
    uint64_t n;
    uint64_t max_symbol, temp;

    uint64_t* freqs
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);
    uint64_t* syms
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);

    /* find max_symbol and check range*/
    max_symbol = 0;
    for (up = input_u32; up < input_u32 + input_size; up++) {
        if (*up + 1 > max_symbol)
            max_symbol = *up + 1;
        SHUFF_CHECK_SYMBOL_RANGE(*up + 1);
    }

    n = shuff_one_pass_freq_count(
        input_u32, input_size, freqs, syms, max_symbol);

    shuff_build_codes(&bio, syms, freqs, n);

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = SHUFF_BYTES_WRITTEN(&bio);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    for (up = input_u32; up < input_u32 + input_size; up++)
        shuff_output(&bio, *up + 1, syms, freqs);

    free(freqs);
    free(syms);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes
        = SHUFF_BYTES_WRITTEN(&bio) - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return SHUFF_FINISH_OUTPUT(&bio);
}